

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *pFxchMan,int iVarNew)

{
  uint uVar1;
  int *piVar2;
  Vec_Wec_t *pVVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  uint uVar16;
  size_t sVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  Vec_Int_t *pVVar21;
  Vec_Int_t *pVVar22;
  long lVar23;
  bool bVar24;
  int fCompl;
  int local_9c;
  undefined8 local_98;
  ulong local_90;
  Vec_Int_t *local_88;
  long local_80;
  Vec_Int_t *local_78;
  Vec_Int_t *local_70;
  Fxch_Man_t *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int *local_50;
  int *local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  local_98 = CONCAT44(in_register_00000034,iVarNew);
  pVVar10 = pFxchMan->vPairs;
  if (1 < pVVar10->nSize) {
    local_58 = iVarNew * 2;
    local_5c = iVarNew * 2 + 1;
    lVar14 = 0;
    local_68 = pFxchMan;
    do {
      iVar7 = pVVar10->pArray[lVar14];
      lVar13 = (long)iVar7;
      uVar16 = pVVar10->pArray[lVar14 + 1];
      local_9c = 0;
      if (lVar13 < 0) goto LAB_004c91c2;
      uVar11 = pFxchMan->vCubes->nSize;
      if ((((int)uVar11 <= iVar7) || (local_38 = lVar14, (int)uVar16 < 0)) || (uVar11 <= uVar16))
      goto LAB_004c91c2;
      pVVar10 = pFxchMan->vCubes->pArray;
      pVVar22 = pVVar10 + lVar13;
      local_90 = (ulong)uVar16;
      local_80 = lVar13;
      pVVar8 = (Vec_Int_t *)malloc(0x10);
      iVar7 = pVVar22->nSize;
      pVVar8->nSize = iVar7;
      pVVar8->nCap = iVar7;
      if ((long)iVar7 == 0) {
        sVar17 = 0;
        piVar9 = (int *)0x0;
      }
      else {
        sVar17 = (long)iVar7 << 2;
        piVar9 = (int *)malloc(sVar17);
      }
      pVVar10 = pVVar10 + local_90;
      pVVar8->pArray = piVar9;
      memcpy(piVar9,pVVar22->pArray,sVar17);
      local_78 = (Vec_Int_t *)malloc(0x10);
      iVar7 = pVVar10->nSize;
      local_78->nSize = iVar7;
      local_78->nCap = iVar7;
      if ((long)iVar7 == 0) {
        sVar17 = 0;
        piVar9 = (int *)0x0;
      }
      else {
        sVar17 = (long)iVar7 << 2;
        piVar9 = (int *)malloc(sVar17);
      }
      pVVar21 = local_78;
      local_78->pArray = piVar9;
      memcpy(piVar9,pVVar10->pArray,sVar17);
      iVar7 = Fxch_DivRemoveLits(pVVar8,pVVar21,pFxchMan->vDiv,&local_9c);
      if (iVar7 != pFxchMan->vDiv->nSize) {
        __assert_fail("RetValue == Vec_IntSize( pFxchMan->vDiv )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x19a,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
      }
      pFxchMan->nLits = (pFxchMan->nLits - (iVar7 + pVVar10->nSize)) + 2;
      uVar16 = pFxchMan->nSizeOutputID;
      uVar11 = uVar16 * (int)local_80;
      if ((int)uVar11 < 0) {
LAB_004c921f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar1 = pFxchMan->vOutputID->nSize;
      if ((((int)uVar1 <= (int)uVar11) || (uVar15 = uVar16 * (int)local_90, (int)uVar15 < 0)) ||
         (uVar1 <= uVar15)) goto LAB_004c921f;
      local_70 = pVVar8;
      if ((int)uVar16 < 1) {
LAB_004c8be0:
        pVVar22->nSize = 0;
        if (0 < pVVar8->nSize) {
          lVar14 = 0;
          do {
            Vec_IntPush(pVVar22,pVVar8->pArray[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar8->nSize);
        }
        Vec_IntPush(pFxchMan->vCubesToUpdate,(int)local_80);
        pVVar10->nSize = 0;
        pVVar10 = pFxchMan->vDiv;
        if (0 < pVVar10->nSize) {
          local_88 = (Vec_Int_t *)pVVar10->pArray;
          pVVar3 = pFxchMan->vLits;
          lVar14 = 0;
          do {
            if ((&local_88->nCap)[lVar14] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar16 = (uint)(&local_88->nCap)[lVar14] >> 1;
            iVar7 = pVVar3->nSize;
            if (iVar7 <= (int)uVar16) goto LAB_004c91c2;
            pVVar4 = pFxchMan->vCubes;
            pVVar21 = pVVar4->pArray;
            if ((pVVar22 < pVVar21) || (pVVar21 + pVVar4->nSize <= pVVar22)) goto LAB_004c91a3;
            pVVar5 = pVVar3->pArray;
            iVar20 = pVVar5[uVar16].nSize;
            iVar19 = (int)((ulong)((long)pVVar22 - (long)pVVar21) >> 4);
            if (0 < (long)iVar20) {
              piVar9 = pVVar5[uVar16].pArray;
              lVar13 = 1;
LAB_004c8cbc:
              pVVar8 = local_70;
              pFxchMan = local_68;
              if (piVar9[lVar13 + -1] != iVar19) goto code_r0x004c8cc3;
              if ((int)lVar13 < iVar20) {
                do {
                  piVar9[lVar13 + -1] = piVar9[lVar13];
                  lVar13 = lVar13 + 1;
                  iVar20 = pVVar5[uVar16].nSize;
                } while ((int)lVar13 < iVar20);
                iVar7 = pVVar3->nSize;
              }
              pVVar5[uVar16].nSize = iVar20 + -1;
              goto LAB_004c8d15;
            }
            if (iVar20 != 0) {
LAB_004c9200:
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
LAB_004c8d15:
            uVar16 = uVar16 ^ 1;
            if (iVar7 <= (int)uVar16) goto LAB_004c91c2;
            if (pVVar21 + pVVar4->nSize <= pVVar22) goto LAB_004c91a3;
            iVar7 = pVVar5[uVar16].nSize;
            if (0 < (long)iVar7) {
              piVar9 = pVVar5[uVar16].pArray;
              lVar13 = 1;
LAB_004c8d59:
              if (piVar9[lVar13 + -1] != iVar19) goto code_r0x004c8d60;
              if ((int)lVar13 < iVar7) {
                do {
                  piVar9[lVar13 + -1] = piVar9[lVar13];
                  lVar13 = lVar13 + 1;
                  iVar7 = pVVar5[uVar16].nSize;
                } while ((int)lVar13 < iVar7);
              }
              pVVar5[uVar16].nSize = iVar7 + -1;
              goto LAB_004c8d9d;
            }
            if (iVar7 != 0) goto LAB_004c9200;
LAB_004c8d9d:
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar10->nSize);
        }
      }
      else {
        piVar2 = pFxchMan->vOutputID->pArray;
        piVar9 = piVar2 + uVar11;
        piVar2 = piVar2 + uVar15;
        uVar12 = 1;
        do {
          lVar14 = uVar12 - 1;
          lVar13 = uVar12 - 1;
          if (uVar16 <= uVar12) break;
          uVar12 = uVar12 + 1;
        } while (piVar9[lVar14] == piVar2[lVar13]);
        if (piVar9[lVar14] == piVar2[lVar13]) goto LAB_004c8be0;
        piVar6 = pFxchMan->pTempOutputID;
        lVar14 = 0;
        do {
          piVar6[lVar14] = piVar2[lVar14] & piVar9[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 < pFxchMan->nSizeOutputID);
        local_50 = piVar2;
        local_48 = piVar9;
        local_40 = pVVar10;
        pVVar10 = Vec_WecPushLevel(pFxchMan->vCubes);
        if (0 < pVVar8->nSize) {
          lVar14 = 0;
          do {
            Vec_IntPush(pVVar10,pVVar8->pArray[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar8->nSize);
        }
        iVar7 = pFxchMan->nSizeOutputID;
        local_88 = pVVar10;
        if (0 < (long)iVar7) {
          pVVar10 = pFxchMan->vOutputID;
          piVar9 = pFxchMan->pTempOutputID;
          lVar14 = 0;
          do {
            Vec_IntPush(pVVar10,piVar9[lVar14]);
            lVar14 = lVar14 + 1;
          } while (iVar7 != lVar14);
        }
        pVVar21 = local_88;
        pVVar10 = pFxchMan->vCubes->pArray;
        if ((local_88 < pVVar10) || (pVVar10 + pFxchMan->vCubes->nSize <= local_88))
        goto LAB_004c91a3;
        Vec_IntPush(pFxchMan->vCubesToUpdate,(int)((ulong)((long)local_88 - (long)pVVar10) >> 4));
        if (1 < pVVar21->nSize) {
          lVar14 = 1;
          do {
            pVVar10 = pFxchMan->vCubes->pArray;
            if ((pVVar21 < pVVar10) || (pVVar10 + pFxchMan->vCubes->nSize <= pVVar21))
            goto LAB_004c91a3;
            uVar16 = pVVar21->pArray[lVar14];
            pVVar3 = pFxchMan->vLits;
            iVar7 = pVVar3->nSize;
            if (iVar7 <= (int)uVar16) {
              iVar19 = uVar16 + 1;
              iVar20 = iVar7 * 2;
              if (iVar7 * 2 <= iVar19) {
                iVar20 = iVar19;
              }
              if (pVVar3->nCap < iVar20) {
                if (pVVar3->pArray == (Vec_Int_t *)0x0) {
                  local_54 = pVVar3->nCap;
                  pVVar8 = (Vec_Int_t *)malloc((long)iVar20 << 4);
                  iVar7 = local_54;
                }
                else {
                  pVVar8 = (Vec_Int_t *)realloc(pVVar3->pArray,(long)iVar20 << 4);
                  iVar7 = pVVar3->nCap;
                }
                pVVar3->pArray = pVVar8;
                memset(pVVar8 + iVar7,0,(long)(iVar20 - iVar7) << 4);
                pVVar3->nCap = iVar20;
              }
              pVVar3->nSize = iVar19;
              iVar7 = iVar19;
            }
            pVVar21 = local_88;
            if (((int)uVar16 < 0) || (iVar7 <= (int)uVar16)) goto LAB_004c91c2;
            Vec_IntPush(pVVar3->pArray + uVar16,(int)((ulong)((long)local_88 - (long)pVVar10) >> 4))
            ;
            lVar14 = lVar14 + 1;
            pFxchMan = local_68;
          } while (lVar14 < pVVar21->nSize);
        }
        pVVar10 = local_40;
        pVVar8 = local_70;
        iVar7 = pFxchMan->nSizeOutputID;
        if (iVar7 < 1) {
LAB_004c8fe8:
          pVVar22->nSize = 0;
        }
        else {
          piVar9 = pFxchMan->pTempOutputID;
          lVar14 = 0;
          uVar16 = 0;
          do {
            uVar11 = local_48[lVar14];
            piVar9[lVar14] = uVar11;
            uVar11 = ~local_50[lVar14] & uVar11;
            uVar16 = uVar16 | uVar11;
            local_48[lVar14] = uVar11;
            lVar14 = lVar14 + 1;
            iVar7 = pFxchMan->nSizeOutputID;
          } while (lVar14 < iVar7);
          if (uVar16 == 0) goto LAB_004c8fe8;
          Vec_IntPush(pFxchMan->vCubesToUpdate,(int)local_80);
          iVar7 = pFxchMan->nSizeOutputID;
        }
        pVVar22 = pVVar21;
        if (iVar7 < 1) {
LAB_004c902e:
          pVVar10->nSize = 0;
        }
        else {
          piVar9 = pFxchMan->pTempOutputID;
          lVar14 = 0;
          uVar16 = 0;
          do {
            uVar11 = ~piVar9[lVar14] & local_50[lVar14];
            uVar16 = uVar16 | uVar11;
            local_50[lVar14] = uVar11;
            lVar14 = lVar14 + 1;
          } while (lVar14 < pFxchMan->nSizeOutputID);
          if (uVar16 == 0) goto LAB_004c902e;
          Vec_IntPush(pFxchMan->vCubesToUpdate,(int)local_90);
        }
      }
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
      if (local_78->pArray != (int *)0x0) {
        free(local_78->pArray);
      }
      free(local_78);
      if ((int)local_98 != 0) {
        lVar14 = (long)pFxchMan->vLits->nSize;
        if (lVar14 < 2) {
LAB_004c91c2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (pVVar22 == (Vec_Int_t *)0x0) {
          __assert_fail("vCube",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                        ,0x1ed,"void Fxch_ManExtractDivFromCubePairs(Fxch_Man_t *, const int)");
        }
        pVVar10 = pFxchMan->vLits->pArray;
        if ((pFxchMan->vDiv->nSize == 2) || (local_9c != 0)) {
          if ((int)local_98 < 0) goto LAB_004c927c;
          Vec_IntPush(pVVar22,local_5c);
          pVVar8 = pFxchMan->vCubes->pArray;
          if ((pVVar22 < pVVar8) || (pVVar8 + pFxchMan->vCubes->nSize <= pVVar22))
          goto LAB_004c91a3;
          lVar13 = lVar14 + -1;
          lVar23 = -8;
          lVar18 = -0xc;
        }
        else {
          if ((int)local_98 < 0) {
LAB_004c927c:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(pVVar22,local_58);
          pVVar8 = pFxchMan->vCubes->pArray;
          if ((pVVar22 < pVVar8) || (pVVar8 + pFxchMan->vCubes->nSize <= pVVar22)) {
LAB_004c91a3:
            __assert_fail("p->pArray <= vLevel && vLevel < p->pArray + p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0xba,"int Vec_WecLevelId(Vec_Wec_t *, Vec_Int_t *)");
          }
          lVar13 = lVar14 + -2;
          lVar23 = -0x18;
          lVar18 = -0x1c;
        }
        Vec_IntPush(pVVar10 + lVar13,(int)((ulong)((long)pVVar22 - (long)pVVar8) >> 4));
        qsort(*(void **)((long)&pVVar10[lVar14].nCap + lVar23),
              (long)*(int *)((long)&pVVar10[lVar14].nCap + lVar18),4,Vec_IntSortCompare1);
      }
      lVar14 = local_38 + 2;
      pVVar10 = pFxchMan->vPairs;
    } while ((int)((uint)lVar14 | 1) < pVVar10->nSize);
  }
  return;
code_r0x004c8cc3:
  lVar18 = lVar13 + 1;
  lVar13 = lVar13 + 1;
  if (lVar18 - iVar20 == 1) goto LAB_004c8d15;
  goto LAB_004c8cbc;
code_r0x004c8d60:
  bVar24 = lVar13 == iVar7;
  lVar13 = lVar13 + 1;
  if (bVar24) goto LAB_004c8d9d;
  goto LAB_004c8d59;
}

Assistant:

static inline void Fxch_ManExtractDivFromCubePairs( Fxch_Man_t* pFxchMan,
                                                   const int iVarNew )
{
    /* For each pair (Ci, Cj) */
    int iCube0, iCube1, i;


    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        int j, Lit,
            RetValue,
            fCompl = 0;
        int * pOutputID0, * pOutputID1;

        Vec_Int_t* vCube = NULL,
                 * vCube0 = Fxch_ManGetCube( pFxchMan, iCube0 ),
                 * vCube1 = Fxch_ManGetCube( pFxchMan, iCube1 ),
                 * vCube0Copy = Vec_IntDup( vCube0 ),
                 * vCube1Copy = Vec_IntDup( vCube1 );

        RetValue  = Fxch_DivRemoveLits( vCube0Copy, vCube1Copy, pFxchMan->vDiv, &fCompl );

        assert( RetValue == Vec_IntSize( pFxchMan->vDiv ) );

        pFxchMan->nLits -= Vec_IntSize( pFxchMan->vDiv ) + Vec_IntSize( vCube1 ) - 2;

        /* Identify type of Extraction */
        pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
        pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
        RetValue = 1;
        for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
            RetValue = ( pOutputID0[j] == pOutputID1[j] );

        /* Exact Extractraion */
        if ( RetValue )
        {
            Vec_IntClear( vCube0 );
            Vec_IntAppend( vCube0, vCube0Copy );
            vCube = vCube0;

            Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            Vec_IntClear( vCube1 );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntry( pFxchMan->vDiv, Lit, j )
            {
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_Lit2Var( Lit ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
                Vec_IntRemove( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Abc_Lit2Var( Lit ) ) ),
                               Vec_WecLevelId( pFxchMan->vCubes, vCube0 ) );
            }

        }
        /* Unexact Extraction */
        else
        {
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                pFxchMan->pTempOutputID[j] = ( pOutputID0[j] & pOutputID1[j] );

            /* Create new cube */
            vCube = Vec_WecPushLevel( pFxchMan->vCubes );
            Vec_IntAppend( vCube, vCube0Copy );
            Vec_IntPushArray( pFxchMan->vOutputID, pFxchMan->pTempOutputID, pFxchMan->nSizeOutputID );
            Vec_IntPush( pFxchMan->vCubesToUpdate, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /* Update Lit -> Cube mapping */
            Vec_IntForEachEntryStart( vCube, Lit, j, 1 )
                Vec_WecPush( pFxchMan->vLits, Lit, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                pFxchMan->pTempOutputID[j] = pOutputID0[j];
                RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                pOutputID0[j] &= ~( pOutputID1[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube0 );
            else
                Vec_IntClear( vCube0 );

            /*********************************************************/
            RetValue = 0;
            for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            {
                RetValue |= ( pOutputID1[j] & ~( pFxchMan->pTempOutputID[j] ) );
                pOutputID1[j] &= ~( pFxchMan->pTempOutputID[j] );
            }

            if ( RetValue != 0 )
                Vec_IntPush( pFxchMan->vCubesToUpdate, iCube1 );
            else
                Vec_IntClear( vCube1 );

        }
        Vec_IntFree( vCube0Copy );
        Vec_IntFree( vCube1Copy );

        if ( iVarNew )
        {
            Vec_Int_t* vLitP = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 2 ),
                     * vLitN = Vec_WecEntry( pFxchMan->vLits, Vec_WecSize( pFxchMan->vLits ) - 1 );

            assert( vCube );
            if ( Vec_IntSize( pFxchMan->vDiv ) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 1 ) );
                Vec_IntPush( vLitN, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitN, 0 );
            }
            else
            {
                Vec_IntPush( vCube, Abc_Var2Lit( iVarNew, 0 ) );
                Vec_IntPush( vLitP, Vec_WecLevelId( pFxchMan->vCubes, vCube ) );
                Vec_IntSort( vLitP, 0 );
            }
        }
    }

    return;
}